

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

bool __thiscall TSMuxer::muxPacket(TSMuxer *this,AVPacket *avPacket)

{
  int *__k;
  map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  *this_00;
  pointer plVar1;
  TSMuxer *pTVar2;
  bool bVar3;
  long lVar4;
  mapped_type_conflict2 *pmVar5;
  mapped_type *pmVar6;
  longlong lVar7;
  byte *pbVar8;
  undefined4 *puVar9;
  byte pesStreamID;
  int iVar10;
  long lVar11;
  long lVar12;
  int64_t iVar13;
  int tsIndex;
  ostringstream ss;
  int local_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  if (avPacket->data == (uint8_t *)0x0) {
    return true;
  }
  if (avPacket->size == 0) {
    return true;
  }
  if (avPacket->stream_index == this->m_mainStreamIndex) {
    if ((avPacket->codec != (BaseAbstractStreamReader *)0x0) &&
       (lVar4 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                               &MPEGStreamReader::typeinfo,0), lVar4 != 0)) {
      this->m_additionCLPISize = (long)(5292000000.0 / *(double *)(lVar4 + 0x88));
    }
    plVar1 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = plVar1[-1];
    lVar12 = 0;
    if (0 < avPacket->duration) {
      lVar12 = avPacket->duration;
    }
    lVar12 = lVar12 + avPacket->pts;
    if (lVar12 < lVar4) {
      lVar12 = lVar4;
    }
    plVar1[-1] = lVar12;
  }
  plVar1 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar1[-1] == -1) {
    lVar4 = avPacket->pts;
    this->m_curFileStartPts = lVar4;
    lVar11 = (lVar4 / 0xe5b0 + this->m_timeOffset) - this->m_vbvLen;
    lVar12 = 0;
    if (0 < lVar11) {
      lVar12 = lVar11;
    }
    this->m_fixed_pcr_offset = lVar12;
    this->m_prevM2TSPCR = lVar12 * 300 + -30000;
    plVar1[-1] = lVar4;
  }
  if (this->m_pcr_delta == -1) {
    this->m_pcr_delta = 7000;
    iVar10 = 0x57e4;
    if (this->m_m2tsMode != false) {
      iVar10 = 7000;
    }
    this->m_patPmtDelta = iVar10;
  }
  __k = &avPacket->stream_index;
  if (this->m_minDts == -1) {
    this->m_minDts = avPacket->dts;
  }
  pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_extIndexToTSIndex,__k);
  local_1cc = *pmVar5;
  if (local_1cc == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unknown track number ",0x15);
    std::ostream::operator<<((ostream *)local_1a8,*__k);
    puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar9 = 200;
    *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
    if (local_1c8 == &local_1b8) {
      puVar9[6] = local_1b8;
      puVar9[7] = uStack_1b4;
      puVar9[8] = uStack_1b0;
      puVar9[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar9 + 2) = local_1c8;
      *(ulong *)(puVar9 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar9 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  lVar4 = avPacket->dts;
  lVar12 = (lVar4 - this->m_minDts) / 0xe5b0 + this->m_fixed_pcr_offset;
  if (this->m_lastPCR == -1) {
    writePATPMT(this,lVar12,true);
    writePCR(this,lVar12);
    lVar4 = avPacket->dts;
  }
  this_00 = &this->m_streamInfo;
  pmVar6 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1cc);
  if ((((lVar4 == pmVar6->m_dts) &&
       (lVar4 = avPacket->pts,
       pmVar6 = std::
                map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
                ::operator[](this_00,&local_1cc), lVar4 == pmVar6->m_pts)) &&
      (local_1cc == this->m_lastTSIndex)) && ((avPacket->flags & 4) == 0)) {
    bVar3 = false;
  }
  else {
    writePESPacket(this);
    bVar3 = true;
  }
  this->m_lastTSIndex = local_1cc;
  if (((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) &&
     (lVar7 = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                      (double)this->m_cbrBitrate), lVar12 <= lVar7)) {
    lVar12 = lVar7;
  }
  if ((bVar3) && (this->m_canSwithBlock == true)) {
    bVar3 = isSplitPoint(this,avPacket);
    if (bVar3) {
      iVar13 = avPacket->pts;
      bVar3 = true;
    }
    else {
      lVar4 = (long)(this->super_AbstractMuxer).m_interliaveBlockSize;
      if ((lVar4 < 1) ||
         ((this->m_processedBlockSize < lVar4 &&
          ((pTVar2 = this->m_sublingMuxer, pTVar2 == (TSMuxer *)0x0 ||
           (pTVar2->m_processedBlockSize < (long)(pTVar2->super_AbstractMuxer).m_interliaveBlockSize
           )))))) goto LAB_001da947;
      iVar13 = avPacket->pts;
      bVar3 = false;
    }
    finishFileBlock(this,iVar13,lVar12,bVar3,true);
  }
  else {
LAB_001da947:
    if (((long)this->m_pcr_delta <= lVar12 - this->m_lastPCR) &&
       (((this->super_AbstractMuxer).m_interliaveBlockSize == 0 || (*__k == this->m_mainStreamIndex)
        ))) {
      writePATPMT(this,lVar12,false);
      writePCR(this,lVar12);
    }
  }
  iVar13 = avPacket->pts;
  pmVar6 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1cc);
  pmVar6->m_pts = iVar13;
  iVar13 = avPacket->dts;
  pmVar6 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1cc);
  pmVar6->m_dts = iVar13;
  pbVar8 = std::
           map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
           ::operator[](&this->m_pesType,&local_1cc);
  pesStreamID = this->m_useNewStyleAudioPES << 6 | 0xbd;
  if (0xb9 < *pbVar8) {
    pesStreamID = *pbVar8;
  }
  addData(this,pesStreamID,local_1cc,avPacket);
  if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
    lVar4 = avPacket->duration;
    if (lVar4 < 1) {
LAB_001daa4d:
      lVar4 = avPacket->dts;
      goto LAB_001daa51;
    }
  }
  else {
    lVar12 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                            &MPEGStreamReader::typeinfo,0);
    lVar4 = avPacket->duration;
    if (lVar4 < 1) {
      if (lVar12 == 0) goto LAB_001daa4d;
      lVar4 = (long)(5292000000.0 / *(double *)(lVar12 + 0x88));
    }
  }
  lVar4 = lVar4 + avPacket->dts;
LAB_001daa51:
  this->m_endStreamDTS = lVar4;
  return true;
}

Assistant:

bool TSMuxer::muxPacket(AVPacket& avPacket)
{
    if (avPacket.data == nullptr || avPacket.size == 0)
    {
        return true;
    }

#ifdef _DEBUG
    // assert (avPacket.dts >= m_lastProcessedDts);
    m_lastProcessedDts = avPacket.dts;
    m_lastStreamIndex = avPacket.stream_index;
#endif

    if (avPacket.stream_index == m_mainStreamIndex)
    {
        const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
        if (mpegReader)
            m_additionCLPISize = static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());

        if (avPacket.duration > 0)
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts + avPacket.duration);
        else
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts);
    }
    if (m_firstPts[m_firstPts.size() - 1] == -1 /*|| avPacket.pts < m_firstPts[m_firstPts.size()-1]*/)
    {
        if (m_firstPts[m_firstPts.size() - 1] == -1)
        {
            m_curFileStartPts = avPacket.pts;
            const int64_t firstPtsShift = internalClockToPts(avPacket.pts);
            m_fixed_pcr_offset = m_timeOffset - m_vbvLen + firstPtsShift;
            if (m_fixed_pcr_offset < 0)
                m_fixed_pcr_offset = 0;
            m_prevM2TSPCR = (m_fixed_pcr_offset - 100) *
                            300;  // add a little extra delta (100) to prevent 0 bitrate for first several packets
        }
        m_firstPts[m_firstPts.size() - 1] = avPacket.pts;
    }

    if (m_pcr_delta == -1)
    {
        if (m_cbrBitrate != -1)
            m_pcr_delta = M_CBR_PCR_DELTA;
        else
            m_pcr_delta = M_PCR_DELTA;
        m_patPmtDelta = m_m2tsMode ? M_PCR_DELTA : PCR_FREQUENCY / 4;
    }

    if (m_minDts == -1)
        m_minDts = avPacket.dts;

    const int tsIndex = m_extIndexToTSIndex[avPacket.stream_index];
    if (tsIndex == 0)
        THROW(ERR_TS_COMMON, "Unknown track number " << avPacket.stream_index)

    auto newPCR = (avPacket.dts - m_minDts) / INT_FREQ_TO_TS_FREQ + m_fixed_pcr_offset;
    if (m_lastPCR == -1)
    {
        writePATPMT(newPCR, true);
        writePCR(newPCR);
    }

    bool newPES = false;
    if (avPacket.dts != m_streamInfo[tsIndex].m_dts || avPacket.pts != m_streamInfo[tsIndex].m_pts ||
        tsIndex != m_lastTSIndex || avPacket.flags & AVPacket::FORCE_NEW_FRAME)
    {
        writePESPacket();
        newPES = true;
    }

    m_lastTSIndex = tsIndex;

    if (m_cbrBitrate != -1 && m_lastPCR != -1)
    {
        const auto cbrPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
        newPCR = FFMAX(newPCR, cbrPCR);
    }

    if (newPES && m_canSwithBlock && isSplitPoint(avPacket))
    {
        finishFileBlock(avPacket.pts, newPCR, true);  // goto next file
    }
    else if (newPES && m_interliaveBlockSize > 0 && m_canSwithBlock &&
             (blockFull() || (m_sublingMuxer && m_sublingMuxer->blockFull())))
    {
        finishFileBlock(avPacket.pts, newPCR, false);  // interleave SSIF here
    }
    else if (newPCR - m_lastPCR >= m_pcr_delta)
    {
        if (m_interliaveBlockSize == 0 || avPacket.stream_index == m_mainStreamIndex)
        {
            writePATPMT(newPCR);
            writePCR(newPCR);
        }
    }

    m_streamInfo[tsIndex].m_pts = avPacket.pts;
    m_streamInfo[tsIndex].m_dts = avPacket.dts;
    uint8_t pesStreamID = m_pesType[tsIndex];
    if (pesStreamID <= SYSTEM_START_CODE)
    {
        if (m_useNewStyleAudioPES)
            pesStreamID = PES_VC1_ID;
        else
            pesStreamID = PES_PRIVATE_DATA1;
    }

    addData(pesStreamID, tsIndex, avPacket);

    const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
    if (avPacket.duration > 0)
        m_endStreamDTS = avPacket.dts + avPacket.duration;
    else if (mpegReader)
        m_endStreamDTS = avPacket.dts + static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());
    else
        m_endStreamDTS = avPacket.dts;

    return true;
}